

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

bool __thiscall
ON_OffsetSurfaceFunction::SetPoint(ON_OffsetSurfaceFunction *this,int index,double s,double t)

{
  ON_OffsetSurfaceValue *pOVar1;
  bool bVar2;
  
  bVar2 = index < (this->m_offset_value).m_count;
  if (bVar2 && -1 < index) {
    pOVar1 = (this->m_offset_value).m_a;
    pOVar1[(uint)index].m_s = s;
    pOVar1[(uint)index].m_t = t;
    this->m_bValid = false;
  }
  return bVar2 && -1 < index;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetPoint( int index, double s, double t)
{
  int count = m_offset_value.Count();
  if( index < 0 || index > count-1)
    return false;

  m_offset_value[index].m_s = s;
  m_offset_value[index].m_t = t;
  m_bValid = false;

  return true;
}